

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_lz4.c
# Opt level: O3

wchar_t archive_filter_lz4_open(archive_write_filter *f)

{
  int *piVar1;
  ushort uVar2;
  wchar_t wVar3;
  archive_string local_38;
  
  piVar1 = (int *)f->data;
  local_38.s = (char *)0x0;
  local_38.length = 0;
  local_38.buffer_length = 0;
  archive_strncat(&local_38,"lz4 -z -q -q",0xc);
  if (0 < *piVar1) {
    archive_strcat(&local_38," -");
    archive_strappend_char(&local_38,(char)*piVar1 + '0');
  }
  archive_strcat(&local_38," -B");
  archive_strappend_char(&local_38,(byte)(*(ushort *)(piVar1 + 1) >> 7) & 7 | 0x30);
  uVar2 = *(ushort *)(piVar1 + 1);
  if ((uVar2 & 8) != 0) {
    archive_strcat(&local_38," -BX");
    uVar2 = *(ushort *)(piVar1 + 1);
  }
  if ((uVar2 & 0x20) == 0) {
    archive_strcat(&local_38," --no-frame-crc");
    uVar2 = *(ushort *)(piVar1 + 1);
  }
  if ((uVar2 & 4) == 0) {
    archive_strcat(&local_38," -BD");
  }
  f->write = archive_filter_lz4_write;
  wVar3 = __archive_write_program_open(f,*(archive_write_program_data **)(piVar1 + 2),local_38.s);
  archive_string_free(&local_38);
  return wVar3;
}

Assistant:

static int
archive_filter_lz4_open(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;
	struct archive_string as;
	int r;

	archive_string_init(&as);
	archive_strcpy(&as, "lz4 -z -q -q");

	/* Specify a compression level. */
	if (data->compression_level > 0) {
		archive_strcat(&as, " -");
		archive_strappend_char(&as, '0' + data->compression_level);
	}
	/* Specify a block size. */
	archive_strcat(&as, " -B");
	archive_strappend_char(&as, '0' + data->block_maximum_size);

	if (data->block_checksum)
		archive_strcat(&as, " -BX");
	if (data->stream_checksum == 0)
		archive_strcat(&as, " --no-frame-crc");
	if (data->block_independence == 0)
		archive_strcat(&as, " -BD");

	f->write = archive_filter_lz4_write;

	r = __archive_write_program_open(f, data->pdata, as.s);
	archive_string_free(&as);
	return (r);
}